

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O2

void mpp_writer_put_bits(MppWriteCtx *ctx,RK_S32 val,RK_S32 len)

{
  uint uVar1;
  RK_U8 RVar2;
  uint uVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  uint uVar6;
  RK_U8 *pRVar7;
  
  pRVar7 = ctx->stream;
  uVar3 = ctx->byte_buffer;
  if ((val != 0) &&
     (((1 << ((byte)len & 0x1f) <= val &&
       (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"val < (1 << len)",
                   "mpp_writer_put_bits",0x77), (mpp_debug._3_1_ & 0x10) != 0)) ||
      ((0x18 < len &&
       (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"len < 25",
                   "mpp_writer_put_bits",0x78), (mpp_debug._3_1_ & 0x10) != 0)))))) {
    abort();
  }
  uVar6 = len + ctx->buffered_bits;
  uVar3 = val << (-(char)uVar6 & 0x1fU) | uVar3;
  while( true ) {
    if ((int)uVar6 < 8) {
      ctx->buffered_bits = uVar6 & 0xff;
      ctx->byte_buffer = uVar3;
      return;
    }
    uVar1 = ctx->byte_cnt;
    if (ctx->size < uVar1) break;
    RVar4 = ctx->zero_bytes;
    RVar2 = (RK_U8)(uVar3 >> 0x18);
    *pRVar7 = RVar2;
    RVar5 = uVar1 + 1;
    if (RVar4 == 2) {
      if (uVar3 < 0x4000000) {
        *pRVar7 = '\x03';
        pRVar7[1] = RVar2;
        ctx->emul_cnt = ctx->emul_cnt + 1;
        RVar2 = pRVar7[1];
        pRVar7 = pRVar7 + 1;
        RVar5 = uVar1 + 2;
        RVar4 = 0;
      }
      else {
        RVar4 = 2;
      }
    }
    RVar4 = RVar4 + 1;
    if (RVar2 != '\0') {
      RVar4 = 0;
    }
    uVar6 = uVar6 - 8;
    uVar3 = uVar3 << 8;
    pRVar7 = pRVar7 + 1;
    ctx->zero_bytes = RVar4;
    ctx->byte_cnt = RVar5;
    ctx->stream = pRVar7;
  }
  ctx->overflow = 1;
  return;
}

Assistant:

void mpp_writer_put_bits(MppWriteCtx * ctx, RK_S32 val, RK_S32 len)
{
    RK_S32 bits;
    RK_U8 *stream = ctx->stream;
    RK_U32 byte_buffer = ctx->byte_buffer;

    if (val) {
        mpp_assert(val < (1 << len));
        mpp_assert(len < 25);
    }
    bits = len + ctx->buffered_bits;

    byte_buffer = byte_buffer | ((RK_U32) val << (32 - bits));

    while (bits > 7) {
        RK_S32 zeroBytes = ctx->zero_bytes;
        RK_S32 byteCnt = ctx->byte_cnt;

        if (mpp_writer_status(ctx))
            return;

        *stream = (RK_U8) (byte_buffer >> 24);

        byteCnt++;
        if ((zeroBytes == 2) && (*stream < 4)) {
            *stream++ = 3;
            *stream = (RK_U8) (byte_buffer >> 24);
            byteCnt++;
            zeroBytes = 0;
            ctx->emul_cnt++;
        }

        if (*stream == 0)
            zeroBytes++;
        else
            zeroBytes = 0;

        bits -= 8;
        byte_buffer <<= 8;
        stream++;
        ctx->zero_bytes = zeroBytes;
        ctx->byte_cnt = byteCnt;
        ctx->stream = stream;
    }

    ctx->buffered_bits = (RK_U8) bits;
    ctx->byte_buffer = byte_buffer;
}